

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# endpoint.hpp
# Opt level: O0

string * __thiscall
m2d::savanna::endpoint::scheme_abi_cxx11_(string *__return_storage_ptr__,endpoint *this)

{
  endpoint *this_local;
  
  std::__cxx11::string::string
            ((string *)__return_storage_ptr__,(string *)url_scheme::https_abi_cxx11_);
  return __return_storage_ptr__;
}

Assistant:

virtual std::string scheme()
		{
			return url_scheme::https;
		}